

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

bool __thiscall CScript::IsPushOnly(CScript *this,const_iterator pc)

{
  uint uVar1;
  uint uVar2;
  const_iterator cVar3;
  bool bVar4;
  CScript *pCVar5;
  const_iterator end;
  long in_FS_OFFSET;
  opcodetype opcode;
  opcodetype local_3c;
  const_iterator local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.ptr = pc.ptr;
  while( true ) {
    cVar3.ptr = local_38.ptr;
    uVar1 = (this->super_CScriptBase)._size;
    uVar2 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
    }
    pCVar5 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar5 = this;
    }
    end.ptr = (uchar *)((pCVar5->super_CScriptBase)._union.direct + (int)uVar2);
    if (end.ptr <= local_38.ptr) break;
    bVar4 = GetScriptOp(&local_38,end,&local_3c,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
    if ((!bVar4) || (0x60 < (int)local_3c)) break;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return end.ptr <= cVar3.ptr;
  }
  __stack_chk_fail();
}

Assistant:

bool CScript::IsPushOnly(const_iterator pc) const
{
    while (pc < end())
    {
        opcodetype opcode;
        if (!GetOp(pc, opcode))
            return false;
        // Note that IsPushOnly() *does* consider OP_RESERVED to be a
        // push-type opcode, however execution of OP_RESERVED fails, so
        // it's not relevant to P2SH/BIP62 as the scriptSig would fail prior to
        // the P2SH special validation code being executed.
        if (opcode > OP_16)
            return false;
    }
    return true;
}